

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateTruncWithCheck<true>(Lowerer *this,Instr *instr)

{
  JnHelperMethod helperMethod;
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  IRType IVar4;
  Opnd *pOVar5;
  undefined4 *puVar6;
  JnHelperMethod helperList [2] [2];
  JnHelperMethod helper;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar5 = IR::Instr::GetSrc1(instr);
  bVar2 = IR::Opnd::IsFloat(pOVar5);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x5209,"(instr->GetSrc1()->IsFloat())","instr->GetSrc1()->IsFloat()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  pOVar5 = IR::Instr::GetDst(instr);
  bVar2 = IR::Opnd::IsInt32(pOVar5);
  if (!bVar2) {
    pOVar5 = IR::Instr::GetDst(instr);
    bVar2 = IR::Opnd::IsUInt32(pOVar5);
    if (!bVar2) {
      pOVar5 = IR::Instr::GetDst(instr);
      bVar2 = IR::Opnd::IsInt64(pOVar5);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x5210,"(instr->GetDst()->IsInt64())","instr->GetDst()->IsInt64()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      LoadScriptContext(this,instr);
      pOVar5 = IR::Instr::GetSrc1(instr);
      bVar2 = IR::Opnd::IsFloat32(pOVar5);
      if (bVar2) {
        pOVar5 = IR::Instr::GetSrc1(instr);
        LowererMD::LoadFloatHelperArgument(&this->m_lowererMD,instr,pOVar5);
      }
      else {
        pOVar5 = IR::Instr::GetSrc1(instr);
        LowererMD::LoadDoubleHelperArgument(&this->m_lowererMD,instr,pOVar5);
      }
      helperList[0][0] = HelperF64ToI64Sat;
      helperList[0][1] = HelperF64ToU64Sat;
      pOVar5 = IR::Instr::GetSrc1(instr);
      IVar3 = IR::Opnd::GetType(pOVar5);
      pOVar5 = IR::Instr::GetDst(instr);
      IVar4 = IR::Opnd::GetType(pOVar5);
      helperMethod = helperList[(ulong)(IVar3 != TyFloat32) - 1][IVar4 == TyUint64];
      IR::Instr::UnlinkSrc1(instr);
      LowererMD::ChangeToHelperCall
                (&this->m_lowererMD,instr,helperMethod,(LabelInstr *)0x0,(Opnd *)0x0,
                 (PropertySymOpnd *)0x0,false);
      return;
    }
  }
  LowererMD::GenerateTruncWithCheck<true>(&this->m_lowererMD,instr);
  return;
}

Assistant:

void Lowerer::GenerateTruncWithCheck(_In_ IR::Instr* instr)
{

    Assert(instr->GetSrc1()->IsFloat());
    if (instr->GetDst()->IsInt32() || instr->GetDst()->IsUInt32())
    {
        m_lowererMD.GenerateTruncWithCheck<Saturate>(instr);
    }
    else
    {
        Assert(instr->GetDst()->IsInt64());
        LoadScriptContext(instr);

        if (instr->GetSrc1()->IsFloat32())
        {
            m_lowererMD.LoadFloatHelperArgument(instr, instr->GetSrc1());
        }
        else
        {
            m_lowererMD.LoadDoubleHelperArgument(instr, instr->GetSrc1());
        }
        IR::JnHelperMethod helper;
        if (Saturate)
        {
            IR::JnHelperMethod helperList[2][2] = { IR::HelperF32ToI64Sat, IR::HelperF32ToU64Sat, IR::HelperF64ToI64Sat ,IR::HelperF64ToU64Sat };
            helper = helperList[instr->GetSrc1()->GetType() != TyFloat32][instr->GetDst()->GetType() == TyUint64];
        }
        else
        {
            IR::JnHelperMethod helperList[2][2] = { IR::HelperF32ToI64, IR::HelperF32ToU64, IR::HelperF64ToI64 ,IR::HelperF64ToU64 };
            helper = helperList[instr->GetSrc1()->GetType() != TyFloat32][instr->GetDst()->GetType() == TyUint64];
        }
        instr->UnlinkSrc1();
        this->m_lowererMD.ChangeToHelperCall(instr, helper);
    }
}